

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizerValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)602>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  Type *pTVar5;
  int index;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar6;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  allocator_type local_a9;
  pointer local_a8;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_80;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  undefined1 local_58 [24];
  TypeCase local_40 [4];
  
  puVar6 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar6 == (ModelDescription *)0x0) {
    puVar6 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_a8);
  local_80.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = false;
  local_80.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = false;
  local_80.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._2_1_ = false;
  local_80.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = false;
  validateModelDescription
            ((Result *)local_68,(ModelDescription *)puVar6,format->specificationversion_,
             (ValidationPolicy *)&local_80);
  local_a8 = (pointer)local_68;
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_60);
  pcVar2 = local_58 + 8;
  if (local_60._M_p != pcVar2) {
    operator_delete(local_60._M_p,local_58._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_a8);
  if (bVar4) {
    local_40[0] = kInt64Type;
    local_40[1] = kDoubleType;
    local_40[2] = kMultiArrayType;
    local_40[3] = kDictionaryType;
    __l._M_len = 4;
    __l._M_array = local_40;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_80,__l,&local_a9);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_68,(CoreML *)&((ModelDescription *)puVar6)->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0,(int)&local_80,
               in_R8);
    local_a8 = (pointer)local_68;
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_60);
    if (local_60._M_p != pcVar2) {
      operator_delete(local_60._M_p,local_58._8_8_ + 1);
    }
    pvVar3 = (void *)CONCAT44(local_80.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_80.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_80.
                                   super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3
                     );
    }
    bVar4 = Result::good((Result *)&local_a8);
    if (bVar4) {
      local_40[0] = 5;
      __l_00._M_len = 1;
      __l_00._M_array = local_40;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_80,__l_00,&local_a9);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_68,(CoreML *)&((ModelDescription *)puVar6)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_80,
                 in_R8);
      local_a8 = (pointer)local_68;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_60);
      if (local_60._M_p != pcVar2) {
        operator_delete(local_60._M_p,local_58._8_8_ + 1);
      }
      pvVar3 = (void *)CONCAT44(local_80.
                                super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_80.
                                super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_80.
                                     super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      bVar4 = Result::good((Result *)&local_a8);
      if (bVar4) {
        if (format->_oneof_case_[0] == 0x25a) {
          puVar6 = (undefined1 *)(format->Type_).supportvectorclassifier_;
        }
        else {
          puVar6 = Specification::_FeatureVectorizer_default_instance_;
        }
        if (0 < *(int *)&(((SupportVectorClassifier *)puVar6)->numberofsupportvectorsperclass_).
                         arena_or_elements_) {
          index = 0;
          do {
            pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
                               ((RepeatedPtrFieldBase *)
                                &((SupportVectorClassifier *)puVar6)->
                                 numberofsupportvectorsperclass_,index);
            if (pTVar5->inputdimensions_ == 0) {
              local_68 = (undefined1  [8])local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,"Dimension size must be greater tha zero.","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
              if (local_68 != (undefined1  [8])local_58) {
                operator_delete((void *)local_68,local_58._0_8_ + 1);
              }
              goto LAB_00301443;
            }
            puVar6 = Specification::_FeatureVectorizer_default_instance_;
            if (format->_oneof_case_[0] == 0x25a) {
              puVar6 = (undefined1 *)(format->Type_).supportvectorclassifier_;
            }
            index = index + 1;
          } while (index < *(int *)&(((SupportVectorClassifier *)puVar6)->
                                    numberofsupportvectorsperclass_).arena_or_elements_);
        }
      }
    }
  }
  *(pointer *)__return_storage_ptr__ = local_a8;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p == &local_90) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_90._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_a0._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_a0._M_p = (pointer)&local_90;
LAB_00301443:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_featureVectorizer>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             0,
                                                             {Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kMultiArrayType,
                                                                 Specification::FeatureType::kDictionaryType});
        if (!result.good()) {
            return result;
        }

            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

            // Validate the parameters
        for (int i = 0; i < format.featurevectorizer().inputlist_size(); i++) {
            auto& element = format.featurevectorizer().inputlist(i);
            auto size = element.inputdimensions();
            if (size <= 0) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Dimension size must be greater tha zero.");
            }
        }

        return result;
    }